

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86_fma::forward_inplace(BinaryOp_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  _func_int *p_Var2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  undefined1 (*pauVar11) [32];
  int iVar12;
  float *pfVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar20 [16];
  undefined8 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  float fVar34;
  float fVar35;
  undefined1 in_ZMM1 [64];
  undefined1 auVar33 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  __m128 afVar40;
  binary_op_pow op;
  __m128 _b;
  __m256 _b_avx;
  binary_op_pow local_109;
  Mat *local_108;
  ulong local_100;
  size_t local_f8;
  size_t local_f0;
  ulong local_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0 [2];
  float afStack_b8 [2];
  float afStack_b0 [2];
  float afStack_a8 [6];
  float local_90 [2];
  float afStack_88 [2];
  float local_80 [2];
  float afStack_78 [2];
  float afStack_70 [2];
  float afStack_68 [14];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  
  p_Var2 = this->_vptr_BinaryOp_x86_fma[-3];
  switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var2)) {
  case 0:
    fVar14 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar8 = 0;
    uVar7 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar7 = uVar8;
    }
    for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar11 = (undefined1 (*) [32])(sVar5 * uVar8 * sVar4 + (long)pvVar3);
      lVar9 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar6; iVar12 = iVar12 + 8) {
        auVar32._0_4_ = fVar14 + *(float *)*pauVar11;
        auVar32._4_4_ = fVar14 + *(float *)((long)*pauVar11 + 4);
        auVar32._8_4_ = fVar14 + *(float *)((long)*pauVar11 + 8);
        auVar32._12_4_ = fVar14 + *(float *)((long)*pauVar11 + 0xc);
        auVar32._16_4_ = fVar14 + *(float *)((long)*pauVar11 + 0x10);
        auVar32._20_4_ = fVar14 + *(float *)((long)*pauVar11 + 0x14);
        auVar32._24_4_ = fVar14 + *(float *)((long)*pauVar11 + 0x18);
        auVar32._28_4_ = fVar14 + *(float *)((long)*pauVar11 + 0x1c);
        *pauVar11 = auVar32;
        pauVar11 = pauVar11 + 1;
        lVar9 = lVar9 + 8;
      }
      for (; iVar12 + 3 < iVar6; iVar12 = iVar12 + 4) {
        auVar30._0_4_ = fVar14 + *(float *)*pauVar11;
        auVar30._4_4_ = fVar14 + *(float *)((long)*pauVar11 + 4);
        auVar30._8_4_ = fVar14 + *(float *)((long)*pauVar11 + 8);
        auVar30._12_4_ = fVar14 + *(float *)((long)*pauVar11 + 0xc);
        *(undefined1 (*) [16])*pauVar11 = auVar30;
        pauVar11 = (undefined1 (*) [32])((long)*pauVar11 + 0x10);
        lVar9 = lVar9 + 4;
      }
      lVar10 = sVar5 * sVar4 * uVar8;
      for (; (int)lVar9 < iVar6; lVar9 = lVar9 + 1) {
        *(float *)((long)pvVar3 + lVar9 * 4 + lVar10) =
             fVar14 + *(float *)((long)pvVar3 + lVar9 * 4 + lVar10);
      }
    }
    break;
  case 1:
    fVar14 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    auVar18._4_4_ = fVar14;
    auVar18._0_4_ = fVar14;
    auVar18._8_4_ = fVar14;
    auVar18._12_4_ = fVar14;
    auVar23._16_4_ = fVar14;
    auVar23._0_16_ = auVar18;
    auVar23._20_4_ = fVar14;
    auVar23._24_4_ = fVar14;
    auVar23._28_4_ = fVar14;
    iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar8 = 0;
    uVar7 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar7 = uVar8;
    }
    for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar11 = (undefined1 (*) [32])(sVar5 * uVar8 * sVar4 + (long)pvVar3);
      lVar9 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar6; iVar12 = iVar12 + 8) {
        auVar25 = vsubps_avx(*pauVar11,auVar23);
        *pauVar11 = auVar25;
        pauVar11 = pauVar11 + 1;
        lVar9 = lVar9 + 8;
      }
      for (; iVar12 + 3 < iVar6; iVar12 = iVar12 + 4) {
        auVar20 = vsubps_avx(*(undefined1 (*) [16])*pauVar11,auVar18);
        *(undefined1 (*) [16])*pauVar11 = auVar20;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        lVar9 = lVar9 + 4;
      }
      lVar10 = sVar5 * sVar4 * uVar8;
      for (; (int)lVar9 < iVar6; lVar9 = lVar9 + 1) {
        *(float *)((long)pvVar3 + lVar9 * 4 + lVar10) =
             *(float *)((long)pvVar3 + lVar9 * 4 + lVar10) - fVar14;
      }
    }
    break;
  case 2:
    fVar14 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar8 = 0;
    uVar7 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar7 = uVar8;
    }
    for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar11 = (undefined1 (*) [32])(sVar5 * uVar8 * sVar4 + (long)pvVar3);
      lVar9 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar6; iVar12 = iVar12 + 8) {
        auVar33._0_4_ = fVar14 * *(float *)*pauVar11;
        auVar33._4_4_ = fVar14 * *(float *)((long)*pauVar11 + 4);
        auVar33._8_4_ = fVar14 * *(float *)((long)*pauVar11 + 8);
        auVar33._12_4_ = fVar14 * *(float *)((long)*pauVar11 + 0xc);
        auVar33._16_4_ = fVar14 * *(float *)((long)*pauVar11 + 0x10);
        auVar33._20_4_ = fVar14 * *(float *)((long)*pauVar11 + 0x14);
        auVar33._28_36_ = in_ZMM1._28_36_;
        auVar33._24_4_ = fVar14 * *(float *)((long)*pauVar11 + 0x18);
        in_ZMM1 = ZEXT3264(auVar33._0_32_);
        *pauVar11 = auVar33._0_32_;
        pauVar11 = pauVar11 + 1;
        lVar9 = lVar9 + 8;
      }
      for (; iVar12 + 3 < iVar6; iVar12 = iVar12 + 4) {
        auVar31._0_4_ = fVar14 * *(float *)*pauVar11;
        auVar31._4_4_ = fVar14 * *(float *)((long)*pauVar11 + 4);
        auVar31._8_4_ = fVar14 * *(float *)((long)*pauVar11 + 8);
        auVar31._12_4_ = fVar14 * *(float *)((long)*pauVar11 + 0xc);
        in_ZMM1 = ZEXT1664(auVar31);
        *(undefined1 (*) [16])*pauVar11 = auVar31;
        pauVar11 = (undefined1 (*) [32])((long)*pauVar11 + 0x10);
        lVar9 = lVar9 + 4;
      }
      lVar10 = sVar5 * sVar4 * uVar8;
      for (; (int)lVar9 < iVar6; lVar9 = lVar9 + 1) {
        fVar34 = fVar14 * *(float *)((long)pvVar3 + lVar9 * 4 + lVar10);
        in_ZMM1 = ZEXT464((uint)fVar34);
        *(float *)((long)pvVar3 + lVar9 * 4 + lVar10) = fVar34;
      }
    }
    break;
  case 3:
    iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    auVar16._0_4_ = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var2);
    auVar16._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar20 = vshufps_avx(auVar16,auVar16,0);
    uVar8 = 0;
    uVar7 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar7 = uVar8;
    }
    for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar11 = (undefined1 (*) [32])(sVar5 * uVar8 * sVar4 + (long)pvVar3);
      lVar9 = 0;
      iVar12 = 0;
      while( true ) {
        fVar14 = auVar20._0_4_;
        fVar34 = auVar20._4_4_;
        fVar35 = auVar20._8_4_;
        if (iVar6 <= iVar12 + 7) break;
        auVar38._0_4_ = fVar14 * *(float *)*pauVar11;
        auVar38._4_4_ = fVar34 * *(float *)((long)*pauVar11 + 4);
        auVar38._8_4_ = fVar35 * *(float *)((long)*pauVar11 + 8);
        auVar38._12_4_ = auVar20._12_4_ * *(float *)((long)*pauVar11 + 0xc);
        auVar38._16_4_ = fVar14 * *(float *)((long)*pauVar11 + 0x10);
        auVar38._20_4_ = fVar34 * *(float *)((long)*pauVar11 + 0x14);
        auVar38._28_36_ = in_ZMM3._28_36_;
        auVar38._24_4_ = fVar35 * *(float *)((long)*pauVar11 + 0x18);
        in_ZMM3 = ZEXT3264(auVar38._0_32_);
        *pauVar11 = auVar38._0_32_;
        pauVar11 = pauVar11 + 1;
        iVar12 = iVar12 + 8;
        lVar9 = lVar9 + 8;
      }
      for (; iVar12 + 3 < iVar6; iVar12 = iVar12 + 4) {
        auVar36._0_4_ = fVar14 * *(float *)*pauVar11;
        auVar36._4_4_ = fVar34 * *(float *)((long)*pauVar11 + 4);
        auVar36._8_4_ = fVar35 * *(float *)((long)*pauVar11 + 8);
        auVar36._12_4_ = auVar20._12_4_ * *(float *)((long)*pauVar11 + 0xc);
        in_ZMM3 = ZEXT1664(auVar36);
        *(undefined1 (*) [16])*pauVar11 = auVar36;
        pauVar11 = (undefined1 (*) [32])((long)*pauVar11 + 0x10);
        lVar9 = lVar9 + 4;
      }
      lVar10 = sVar5 * sVar4 * uVar8;
      for (; (int)lVar9 < iVar6; lVar9 = lVar9 + 1) {
        fVar14 = auVar16._0_4_ * *(float *)((long)pvVar3 + lVar9 * 4 + lVar10);
        in_ZMM3 = ZEXT464((uint)fVar14);
        *(float *)((long)pvVar3 + lVar9 * 4 + lVar10) = fVar14;
      }
    }
    break;
  case 4:
    uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
    auVar15._4_4_ = uVar1;
    auVar15._0_4_ = uVar1;
    auVar15._8_4_ = uVar1;
    auVar15._12_4_ = uVar1;
    auVar21._16_4_ = uVar1;
    auVar21._0_16_ = auVar15;
    auVar21._20_4_ = uVar1;
    auVar21._24_4_ = uVar1;
    auVar21._28_4_ = uVar1;
    iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar8 = 0;
    uVar7 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar7 = uVar8;
    }
    for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar11 = (undefined1 (*) [32])(sVar5 * uVar8 * sVar4 + (long)pvVar3);
      lVar9 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar6; iVar12 = iVar12 + 8) {
        auVar25 = vmaxps_avx(auVar21,*pauVar11);
        *pauVar11 = auVar25;
        pauVar11 = pauVar11 + 1;
        lVar9 = lVar9 + 8;
      }
      for (; iVar12 + 3 < iVar6; iVar12 = iVar12 + 4) {
        auVar20 = vmaxps_avx(auVar15,*(undefined1 (*) [16])*pauVar11);
        *(undefined1 (*) [16])*pauVar11 = auVar20;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        lVar9 = lVar9 + 4;
      }
      lVar10 = sVar5 * sVar4 * uVar8;
      for (; (int)lVar9 < iVar6; lVar9 = lVar9 + 1) {
        auVar20 = vmaxss_avx(auVar15,ZEXT416(*(uint *)((long)pvVar3 + lVar9 * 4 + lVar10)));
        *(int *)((long)pvVar3 + lVar9 * 4 + lVar10) = auVar20._0_4_;
      }
    }
    break;
  case 5:
    uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
    auVar19._4_4_ = uVar1;
    auVar19._0_4_ = uVar1;
    auVar19._8_4_ = uVar1;
    auVar19._12_4_ = uVar1;
    auVar24._16_4_ = uVar1;
    auVar24._0_16_ = auVar19;
    auVar24._20_4_ = uVar1;
    auVar24._24_4_ = uVar1;
    auVar24._28_4_ = uVar1;
    iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar8 = 0;
    uVar7 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar7 = uVar8;
    }
    for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar11 = (undefined1 (*) [32])(sVar5 * uVar8 * sVar4 + (long)pvVar3);
      lVar9 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar6; iVar12 = iVar12 + 8) {
        auVar25 = vminps_avx(auVar24,*pauVar11);
        *pauVar11 = auVar25;
        pauVar11 = pauVar11 + 1;
        lVar9 = lVar9 + 8;
      }
      for (; iVar12 + 3 < iVar6; iVar12 = iVar12 + 4) {
        auVar20 = vminps_avx(auVar19,*(undefined1 (*) [16])*pauVar11);
        *(undefined1 (*) [16])*pauVar11 = auVar20;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        lVar9 = lVar9 + 4;
      }
      lVar10 = sVar5 * sVar4 * uVar8;
      for (; (int)lVar9 < iVar6; lVar9 = lVar9 + 1) {
        auVar20 = vminss_avx(auVar19,ZEXT416(*(uint *)((long)pvVar3 + lVar9 * 4 + lVar10)));
        *(int *)((long)pvVar3 + lVar9 * 4 + lVar10) = auVar20._0_4_;
      }
    }
    break;
  case 6:
    local_e0 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_e8 = 0;
    local_108 = bottom_top_blob;
    local_100 = (ulong)(uint)bottom_top_blob->c;
    fStack_dc = local_e0;
    fStack_d8 = local_e0;
    fStack_d4 = local_e0;
    fStack_d0 = local_e0;
    fStack_cc = local_e0;
    fStack_c8 = local_e0;
    fStack_c4 = local_e0;
    if (bottom_top_blob->c < 1) {
      local_100 = local_e8;
    }
    while (local_e8 != local_100) {
      pvVar3 = bottom_top_blob->data;
      local_f8 = bottom_top_blob->elemsize;
      local_f0 = bottom_top_blob->cstep;
      pfVar13 = (float *)(local_f0 * local_e8 * local_f8 + (long)pvVar3);
      local_80[1] = fStack_dc;
      local_80[0] = local_e0;
      afStack_78[1] = fStack_d4;
      afStack_78[0] = fStack_d8;
      afStack_70[1] = fStack_cc;
      afStack_70[0] = fStack_d0;
      afStack_68[1] = fStack_c4;
      afStack_68[0] = fStack_c8;
      lVar9 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar6; iVar12 = iVar12 + 8) {
        uVar27 = *(undefined8 *)pfVar13;
        uVar26 = *(undefined8 *)(pfVar13 + 2);
        uVar28 = *(undefined8 *)(pfVar13 + 4);
        uVar29 = *(undefined8 *)(pfVar13 + 6);
        local_c0 = (float  [2])uVar27;
        afStack_b8 = (float  [2])uVar26;
        afStack_b0 = (float  [2])uVar28;
        afStack_a8._0_8_ = uVar29;
        BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                  (&local_109,(__m256 *)local_c0,(__m256 *)local_80);
        *(undefined8 *)pfVar13 = uVar27;
        *(undefined8 *)(pfVar13 + 2) = uVar26;
        *(undefined8 *)(pfVar13 + 4) = uVar28;
        *(undefined8 *)(pfVar13 + 6) = uVar29;
        pfVar13 = pfVar13 + 8;
        lVar9 = lVar9 + 8;
      }
      local_c0[1] = fStack_dc;
      local_c0[0] = local_e0;
      afStack_b8[1] = fStack_d4;
      afStack_b8[0] = fStack_d8;
      for (; uVar7 = local_e8, bottom_top_blob = local_108, iVar12 + 3 < iVar6; iVar12 = iVar12 + 4)
      {
        local_90 = *(float (*) [2])pfVar13;
        uVar27 = *(undefined8 *)(pfVar13 + 2);
        afStack_88 = (float  [2])uVar27;
        afVar40 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                            (&local_109,(__m128 *)local_90,(__m128 *)local_c0);
        *(long *)pfVar13 = afVar40._0_8_;
        *(undefined8 *)(pfVar13 + 2) = uVar27;
        pfVar13 = pfVar13 + 4;
        lVar9 = lVar9 + 4;
      }
      lVar10 = local_f0 * local_f8 * local_e8;
      for (; (int)lVar9 < iVar6; lVar9 = lVar9 + 1) {
        fVar14 = powf(*(float *)((long)pvVar3 + lVar9 * 4 + lVar10),local_e0);
        *(float *)((long)pvVar3 + lVar9 * 4 + lVar10) = fVar14;
      }
      local_e8 = uVar7 + 1;
    }
    break;
  case 7:
    fVar14 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    auVar17._4_4_ = fVar14;
    auVar17._0_4_ = fVar14;
    auVar17._8_4_ = fVar14;
    auVar17._12_4_ = fVar14;
    auVar22._16_4_ = fVar14;
    auVar22._0_16_ = auVar17;
    auVar22._20_4_ = fVar14;
    auVar22._24_4_ = fVar14;
    auVar22._28_4_ = fVar14;
    iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar8 = 0;
    uVar7 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar7 = uVar8;
    }
    for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar11 = (undefined1 (*) [32])(sVar5 * uVar8 * sVar4 + (long)pvVar3);
      lVar9 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar6; iVar12 = iVar12 + 8) {
        auVar25 = vsubps_avx(auVar22,*pauVar11);
        *pauVar11 = auVar25;
        pauVar11 = pauVar11 + 1;
        lVar9 = lVar9 + 8;
      }
      for (; iVar12 + 3 < iVar6; iVar12 = iVar12 + 4) {
        auVar20 = vsubps_avx(auVar17,*(undefined1 (*) [16])*pauVar11);
        *(undefined1 (*) [16])*pauVar11 = auVar20;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        lVar9 = lVar9 + 4;
      }
      lVar10 = sVar5 * sVar4 * uVar8;
      for (; (int)lVar9 < iVar6; lVar9 = lVar9 + 1) {
        *(float *)((long)pvVar3 + lVar9 * 4 + lVar10) =
             fVar14 - *(float *)((long)pvVar3 + lVar9 * 4 + lVar10);
      }
    }
    break;
  case 8:
    fVar14 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    auVar20._4_4_ = fVar14;
    auVar20._0_4_ = fVar14;
    auVar20._8_4_ = fVar14;
    auVar20._12_4_ = fVar14;
    auVar25._16_4_ = fVar14;
    auVar25._0_16_ = auVar20;
    auVar25._20_4_ = fVar14;
    auVar25._24_4_ = fVar14;
    auVar25._28_4_ = fVar14;
    iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar8 = 0;
    uVar7 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar7 = uVar8;
    }
    for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar11 = (undefined1 (*) [32])(sVar5 * uVar8 * sVar4 + (long)pvVar3);
      lVar9 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar6; iVar12 = iVar12 + 8) {
        auVar22 = vrcpps_avx(*pauVar11);
        auVar39._0_4_ = fVar14 * auVar22._0_4_;
        auVar39._4_4_ = fVar14 * auVar22._4_4_;
        auVar39._8_4_ = fVar14 * auVar22._8_4_;
        auVar39._12_4_ = fVar14 * auVar22._12_4_;
        auVar39._16_4_ = fVar14 * auVar22._16_4_;
        auVar39._20_4_ = fVar14 * auVar22._20_4_;
        auVar39._28_36_ = in_ZMM3._28_36_;
        auVar39._24_4_ = fVar14 * auVar22._24_4_;
        auVar24 = auVar39._0_32_;
        in_ZMM3 = ZEXT3264(auVar24);
        auVar17 = vfmsub213ps_fma(*pauVar11,auVar24,auVar25);
        auVar17 = vfnmadd213ps_fma(ZEXT1632(auVar17),auVar22,auVar24);
        *pauVar11 = ZEXT1632(auVar17);
        pauVar11 = pauVar11 + 1;
        lVar9 = lVar9 + 8;
      }
      for (; iVar12 + 3 < iVar6; iVar12 = iVar12 + 4) {
        auVar17 = vrcpps_avx(*(undefined1 (*) [16])*pauVar11);
        auVar37._0_4_ = fVar14 * auVar17._0_4_;
        auVar37._4_4_ = fVar14 * auVar17._4_4_;
        auVar37._8_4_ = fVar14 * auVar17._8_4_;
        auVar37._12_4_ = fVar14 * auVar17._12_4_;
        in_ZMM3 = ZEXT1664(auVar37);
        auVar19 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar11,auVar37,auVar20);
        auVar17 = vfnmadd213ps_fma(auVar19,auVar17,auVar37);
        *(undefined1 (*) [16])*pauVar11 = auVar17;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        lVar9 = lVar9 + 4;
      }
      lVar10 = sVar5 * sVar4 * uVar8;
      for (; (int)lVar9 < iVar6; lVar9 = lVar9 + 1) {
        *(float *)((long)pvVar3 + lVar9 * 4 + lVar10) =
             fVar14 / *(float *)((long)pvVar3 + lVar9 * 4 + lVar10);
      }
    }
  }
  return 0;
}

Assistant:

int BinaryOp_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace BinaryOp_x86_fma_functor;

    if (op_type == Operation_ADD)
        return binary_op_scalar_inplace<binary_op_add>(bottom_top_blob, b, opt);

    if (op_type == Operation_SUB)
        return binary_op_scalar_inplace<binary_op_sub>(bottom_top_blob, b, opt);

    if (op_type == Operation_MUL)
        return binary_op_scalar_inplace<binary_op_mul>(bottom_top_blob, b, opt);

    if (op_type == Operation_DIV)
        return binary_op_scalar_inplace<binary_op_div>(bottom_top_blob, b, opt);

    if (op_type == Operation_MAX)
        return binary_op_scalar_inplace<binary_op_max>(bottom_top_blob, b, opt);

    if (op_type == Operation_MIN)
        return binary_op_scalar_inplace<binary_op_min>(bottom_top_blob, b, opt);

    if (op_type == Operation_POW)
        return binary_op_scalar_inplace<binary_op_pow>(bottom_top_blob, b, opt);

    if (op_type == Operation_RSUB)
        return binary_op_scalar_inplace<binary_op_rsub>(bottom_top_blob, b, opt);

    if (op_type == Operation_RDIV)
        return binary_op_scalar_inplace<binary_op_rdiv>(bottom_top_blob, b, opt);

    return 0;
}